

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 (*pauVar17) [16];
  byte bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  byte bVar22;
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  long lVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  undefined4 uVar31;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar44 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  undefined1 local_23a0 [8];
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_23a0 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar42 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar32 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar42 = ZEXT1664(auVar32);
  }
  pauVar23 = (undefined1 (*) [16])local_2390;
  uVar31 = *(undefined4 *)&(query->p).field_0;
  local_23e0._4_4_ = uVar31;
  local_23e0._0_4_ = uVar31;
  local_23e0._8_4_ = uVar31;
  local_23e0._12_4_ = uVar31;
  local_23e0._16_4_ = uVar31;
  local_23e0._20_4_ = uVar31;
  local_23e0._24_4_ = uVar31;
  local_23e0._28_4_ = uVar31;
  auVar40 = ZEXT3264(local_23e0);
  uVar31 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_2400._4_4_ = uVar31;
  local_2400._0_4_ = uVar31;
  local_2400._8_4_ = uVar31;
  local_2400._12_4_ = uVar31;
  local_2400._16_4_ = uVar31;
  local_2400._20_4_ = uVar31;
  local_2400._24_4_ = uVar31;
  local_2400._28_4_ = uVar31;
  auVar41 = ZEXT3264(local_2400);
  uVar31 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_2420._4_4_ = uVar31;
  local_2420._0_4_ = uVar31;
  local_2420._8_4_ = uVar31;
  local_2420._12_4_ = uVar31;
  local_2420._16_4_ = uVar31;
  local_2420._20_4_ = uVar31;
  local_2420._24_4_ = uVar31;
  local_2420._28_4_ = uVar31;
  auVar43 = ZEXT3264(local_2420);
  uVar31 = *(undefined4 *)&(context->query_radius).field_0;
  auVar34._4_4_ = uVar31;
  auVar34._0_4_ = uVar31;
  auVar34._8_4_ = uVar31;
  auVar34._12_4_ = uVar31;
  auVar34._16_4_ = uVar31;
  auVar34._20_4_ = uVar31;
  auVar34._24_4_ = uVar31;
  auVar34._28_4_ = uVar31;
  uVar31 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar36._4_4_ = uVar31;
  auVar36._0_4_ = uVar31;
  auVar36._8_4_ = uVar31;
  auVar36._12_4_ = uVar31;
  auVar36._16_4_ = uVar31;
  auVar36._20_4_ = uVar31;
  auVar36._24_4_ = uVar31;
  auVar36._28_4_ = uVar31;
  uVar31 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar38._4_4_ = uVar31;
  auVar38._0_4_ = uVar31;
  auVar38._8_4_ = uVar31;
  auVar38._12_4_ = uVar31;
  auVar38._16_4_ = uVar31;
  auVar38._20_4_ = uVar31;
  auVar38._24_4_ = uVar31;
  auVar38._28_4_ = uVar31;
  bVar20 = false;
  do {
    local_2440 = vsubps_avx(auVar40._0_32_,auVar34);
    fVar5 = auVar34._0_4_;
    fVar6 = auVar34._4_4_;
    fVar7 = auVar34._8_4_;
    fVar8 = auVar34._12_4_;
    fVar9 = auVar34._16_4_;
    fVar10 = auVar34._20_4_;
    fVar11 = auVar34._24_4_;
    local_2460 = auVar40._0_4_ + fVar5;
    fStack_245c = auVar40._4_4_ + fVar6;
    fStack_2458 = auVar40._8_4_ + fVar7;
    fStack_2454 = auVar40._12_4_ + fVar8;
    fStack_2450 = auVar40._16_4_ + fVar9;
    fStack_244c = auVar40._20_4_ + fVar10;
    fStack_2448 = auVar40._24_4_ + fVar11;
    fStack_2444 = auVar40._28_4_ + auVar34._28_4_;
    local_2480 = vsubps_avx(auVar41._0_32_,auVar36);
    local_24a0 = auVar41._0_4_ + auVar36._0_4_;
    fStack_249c = auVar41._4_4_ + auVar36._4_4_;
    fStack_2498 = auVar41._8_4_ + auVar36._8_4_;
    fStack_2494 = auVar41._12_4_ + auVar36._12_4_;
    fStack_2490 = auVar41._16_4_ + auVar36._16_4_;
    fStack_248c = auVar41._20_4_ + auVar36._20_4_;
    fStack_2488 = auVar41._24_4_ + auVar36._24_4_;
    fStack_2484 = auVar41._28_4_ + auVar36._28_4_;
    local_24c0 = vsubps_avx(auVar43._0_32_,auVar38);
    local_24e0._0_4_ = auVar43._0_4_ + auVar38._0_4_;
    local_24e0._4_4_ = auVar43._4_4_ + auVar38._4_4_;
    local_24e0._8_4_ = auVar43._8_4_ + auVar38._8_4_;
    local_24e0._12_4_ = auVar43._12_4_ + auVar38._12_4_;
    local_24e0._16_4_ = auVar43._16_4_ + auVar38._16_4_;
    local_24e0._20_4_ = auVar43._20_4_ + auVar38._20_4_;
    local_24e0._24_4_ = auVar43._24_4_ + auVar38._24_4_;
    local_24e0._28_4_ = auVar43._28_4_ + auVar38._28_4_;
    auVar44._0_4_ = fVar5 * fVar5;
    auVar44._4_4_ = fVar6 * fVar6;
    auVar44._8_4_ = fVar7 * fVar7;
    auVar44._12_4_ = fVar8 * fVar8;
    auVar44._16_4_ = fVar9 * fVar9;
    auVar44._20_4_ = fVar10 * fVar10;
    auVar44._28_36_ = in_ZMM12._28_36_;
    auVar44._24_4_ = fVar11 * fVar11;
    in_ZMM12 = ZEXT3264(auVar44._0_32_);
    local_24f0 = auVar42._0_16_;
    local_23c0 = auVar44._0_32_;
    do {
      do {
        do {
          if (pauVar23 == (undefined1 (*) [16])local_23a0) {
            return bVar20;
          }
          pauVar17 = pauVar23 + -1;
          pauVar23 = pauVar23 + -1;
        } while (auVar42._0_4_ < *(float *)(*pauVar17 + 8));
        uVar29 = *(ulong *)*pauVar23;
        do {
          auVar34 = auVar40._0_32_;
          auVar36 = auVar41._0_32_;
          auVar38 = auVar43._0_32_;
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar29 & 8) == 0) {
              auVar12 = vmaxps_avx(auVar34,*(undefined1 (*) [32])(uVar29 + 0x40));
              auVar12 = vminps_avx(auVar12,*(undefined1 (*) [32])(uVar29 + 0x60));
              auVar15 = vsubps_avx(auVar12,auVar34);
              auVar34 = vmaxps_avx(auVar36,*(undefined1 (*) [32])(uVar29 + 0x80));
              auVar12 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar29 + 0xa0));
              auVar34 = vmaxps_avx(auVar38,*(undefined1 (*) [32])(uVar29 + 0xc0));
              auVar34 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar29 + 0xe0));
              auVar36 = vsubps_avx(auVar12,auVar36);
              auVar34 = vsubps_avx(auVar34,auVar38);
              local_2520._0_4_ =
                   auVar15._0_4_ * auVar15._0_4_ + auVar36._0_4_ * auVar36._0_4_ +
                   auVar34._0_4_ * auVar34._0_4_;
              local_2520._4_4_ =
                   auVar15._4_4_ * auVar15._4_4_ + auVar36._4_4_ * auVar36._4_4_ +
                   auVar34._4_4_ * auVar34._4_4_;
              fStack_2518 = auVar15._8_4_ * auVar15._8_4_ + auVar36._8_4_ * auVar36._8_4_ +
                            auVar34._8_4_ * auVar34._8_4_;
              fStack_2514 = auVar15._12_4_ * auVar15._12_4_ + auVar36._12_4_ * auVar36._12_4_ +
                            auVar34._12_4_ * auVar34._12_4_;
              fStack_2510 = auVar15._16_4_ * auVar15._16_4_ + auVar36._16_4_ * auVar36._16_4_ +
                            auVar34._16_4_ * auVar34._16_4_;
              fStack_250c = auVar15._20_4_ * auVar15._20_4_ + auVar36._20_4_ * auVar36._20_4_ +
                            auVar34._20_4_ * auVar34._20_4_;
              fStack_2508 = auVar15._24_4_ * auVar15._24_4_ + auVar36._24_4_ * auVar36._24_4_ +
                            auVar34._24_4_ * auVar34._24_4_;
              fStack_2504 = auVar15._28_4_ + auVar36._28_4_ + auVar36._28_4_;
              auVar34 = vcmpps_avx(_local_2520,in_ZMM12._0_32_,2);
              auVar36 = vcmpps_avx(*(undefined1 (*) [32])(uVar29 + 0x40),
                                   *(undefined1 (*) [32])(uVar29 + 0x60),2);
              auVar34 = vandps_avx(auVar34,auVar36);
LAB_015c40aa:
              uVar31 = vmovmskps_avx(auVar34);
              unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar31);
            }
          }
          else if ((uVar29 & 8) == 0) {
            auVar12 = *(undefined1 (*) [32])(uVar29 + 0x40);
            auVar15 = *(undefined1 (*) [32])(uVar29 + 0x60);
            auVar13 = vmaxps_avx(auVar34,auVar12);
            auVar13 = vminps_avx(auVar13,auVar15);
            auVar13 = vsubps_avx(auVar13,auVar34);
            auVar34 = vmaxps_avx(auVar36,*(undefined1 (*) [32])(uVar29 + 0x80));
            auVar34 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar29 + 0xa0));
            auVar36 = vsubps_avx(auVar34,auVar36);
            auVar34 = vmaxps_avx(auVar38,*(undefined1 (*) [32])(uVar29 + 0xc0));
            auVar34 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar29 + 0xe0));
            auVar34 = vsubps_avx(auVar34,auVar38);
            local_2520._4_4_ =
                 auVar13._4_4_ * auVar13._4_4_ + auVar36._4_4_ * auVar36._4_4_ +
                 auVar34._4_4_ * auVar34._4_4_;
            local_2520._0_4_ =
                 auVar13._0_4_ * auVar13._0_4_ + auVar36._0_4_ * auVar36._0_4_ +
                 auVar34._0_4_ * auVar34._0_4_;
            fStack_2518 = auVar13._8_4_ * auVar13._8_4_ + auVar36._8_4_ * auVar36._8_4_ +
                          auVar34._8_4_ * auVar34._8_4_;
            fStack_2514 = auVar13._12_4_ * auVar13._12_4_ + auVar36._12_4_ * auVar36._12_4_ +
                          auVar34._12_4_ * auVar34._12_4_;
            fStack_2510 = auVar13._16_4_ * auVar13._16_4_ + auVar36._16_4_ * auVar36._16_4_ +
                          auVar34._16_4_ * auVar34._16_4_;
            fStack_250c = auVar13._20_4_ * auVar13._20_4_ + auVar36._20_4_ * auVar36._20_4_ +
                          auVar34._20_4_ * auVar34._20_4_;
            fStack_2508 = auVar13._24_4_ * auVar13._24_4_ + auVar36._24_4_ * auVar36._24_4_ +
                          auVar34._24_4_ * auVar34._24_4_;
            fStack_2504 = auVar13._28_4_ + auVar36._28_4_ + auVar34._28_4_;
            auVar16._4_4_ = fStack_245c;
            auVar16._0_4_ = local_2460;
            auVar16._8_4_ = fStack_2458;
            auVar16._12_4_ = fStack_2454;
            auVar16._16_4_ = fStack_2450;
            auVar16._20_4_ = fStack_244c;
            auVar16._24_4_ = fStack_2448;
            auVar16._28_4_ = fStack_2444;
            auVar34 = vcmpps_avx(auVar12,auVar16,2);
            auVar13._4_4_ = fStack_249c;
            auVar13._0_4_ = local_24a0;
            auVar13._8_4_ = fStack_2498;
            auVar13._12_4_ = fStack_2494;
            auVar13._16_4_ = fStack_2490;
            auVar13._20_4_ = fStack_248c;
            auVar13._24_4_ = fStack_2488;
            auVar13._28_4_ = fStack_2484;
            auVar36 = vcmpps_avx(*(undefined1 (*) [32])(uVar29 + 0x80),auVar13,2);
            auVar34 = vandps_avx(auVar36,auVar34);
            auVar36 = vcmpps_avx(*(undefined1 (*) [32])(uVar29 + 0xc0),local_24e0,2);
            auVar38 = vcmpps_avx(auVar15,local_2440,5);
            auVar36 = vandps_avx(auVar36,auVar38);
            auVar34 = vandps_avx(auVar34,auVar36);
            auVar36 = vcmpps_avx(auVar12,auVar15,2);
            auVar38 = vcmpps_avx(*(undefined1 (*) [32])(uVar29 + 0xa0),local_2480,5);
            auVar36 = vandps_avx(auVar36,auVar38);
            auVar38 = vcmpps_avx(*(undefined1 (*) [32])(uVar29 + 0xe0),local_24c0,5);
            auVar36 = vandps_avx(auVar36,auVar38);
            auVar34 = vandps_avx(auVar34,auVar36);
            goto LAB_015c40aa;
          }
          if ((uVar29 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar21 = 4;
            }
            else {
              uVar28 = uVar29 & 0xfffffffffffffff0;
              lVar30 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              iVar21 = 0;
              uVar29 = *(ulong *)(uVar28 + lVar30 * 8);
              uVar27 = unaff_R15 - 1 & unaff_R15;
              if (uVar27 != 0) {
                uVar3 = *(uint *)(local_2520 + lVar30 * 4);
                lVar30 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar28 + lVar30 * 8);
                uVar2 = *(uint *)(local_2520 + lVar30 * 4);
                uVar27 = uVar27 - 1 & uVar27;
                if (uVar27 == 0) {
                  if (uVar3 < uVar2) {
                    *(ulong *)*pauVar23 = uVar4;
                    *(uint *)(*pauVar23 + 8) = uVar2;
                    pauVar23 = pauVar23 + 1;
                  }
                  else {
                    *(ulong *)*pauVar23 = uVar29;
                    *(uint *)(*pauVar23 + 8) = uVar3;
                    pauVar23 = pauVar23 + 1;
                    uVar29 = uVar4;
                  }
                }
                else {
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = uVar29;
                  auVar32 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar3));
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = uVar4;
                  auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar2));
                  lVar30 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = *(ulong *)(uVar28 + lVar30 * 8);
                  auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_2520 + lVar30 * 4)));
                  uVar27 = uVar27 - 1 & uVar27;
                  if (uVar27 == 0) {
                    auVar39 = vpcmpgtd_avx(auVar35,auVar32);
                    auVar33 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar35,auVar32,auVar33);
                    auVar32 = vblendvps_avx(auVar32,auVar35,auVar33);
                    auVar35 = vpcmpgtd_avx(auVar37,auVar39);
                    auVar33 = vpshufd_avx(auVar35,0xaa);
                    auVar35 = vblendvps_avx(auVar37,auVar39,auVar33);
                    auVar37 = vblendvps_avx(auVar39,auVar37,auVar33);
                    auVar39 = vpcmpgtd_avx(auVar37,auVar32);
                    auVar33 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar37,auVar32,auVar33);
                    auVar32 = vblendvps_avx(auVar32,auVar37,auVar33);
                    *pauVar23 = auVar32;
                    pauVar23[1] = auVar39;
                    pauVar23 = pauVar23 + 2;
                    uVar29 = auVar35._0_8_;
                  }
                  else {
                    lVar30 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = *(ulong *)(uVar28 + lVar30 * 8);
                    auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_2520 + lVar30 * 4)));
                    uVar27 = uVar27 - 1 & uVar27;
                    iVar21 = 0;
                    if (uVar27 == 0) {
                      auVar33 = vpcmpgtd_avx(auVar35,auVar32);
                      auVar14 = vpshufd_avx(auVar33,0xaa);
                      auVar33 = vblendvps_avx(auVar35,auVar32,auVar14);
                      auVar32 = vblendvps_avx(auVar32,auVar35,auVar14);
                      auVar35 = vpcmpgtd_avx(auVar39,auVar37);
                      auVar14 = vpshufd_avx(auVar35,0xaa);
                      auVar35 = vblendvps_avx(auVar39,auVar37,auVar14);
                      auVar37 = vblendvps_avx(auVar37,auVar39,auVar14);
                      auVar39 = vpcmpgtd_avx(auVar37,auVar32);
                      auVar14 = vpshufd_avx(auVar39,0xaa);
                      auVar39 = vblendvps_avx(auVar37,auVar32,auVar14);
                      auVar32 = vblendvps_avx(auVar32,auVar37,auVar14);
                      auVar37 = vpcmpgtd_avx(auVar35,auVar33);
                      auVar14 = vpshufd_avx(auVar37,0xaa);
                      auVar37 = vblendvps_avx(auVar35,auVar33,auVar14);
                      auVar35 = vblendvps_avx(auVar33,auVar35,auVar14);
                      auVar33 = vpcmpgtd_avx(auVar39,auVar35);
                      auVar14 = vpshufd_avx(auVar33,0xaa);
                      auVar33 = vblendvps_avx(auVar39,auVar35,auVar14);
                      auVar35 = vblendvps_avx(auVar35,auVar39,auVar14);
                      *pauVar23 = auVar32;
                      pauVar23[1] = auVar35;
                      pauVar23[2] = auVar33;
                      pauVar23 = pauVar23 + 3;
                      uVar29 = auVar37._0_8_;
                    }
                    else {
                      *pauVar23 = auVar32;
                      pauVar23[1] = auVar35;
                      pauVar23[2] = auVar37;
                      pauVar23[3] = auVar39;
                      lVar30 = 0x30;
                      do {
                        lVar25 = lVar30;
                        lVar30 = 0;
                        if (uVar27 != 0) {
                          for (; (uVar27 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                          }
                        }
                        auVar33._8_8_ = 0;
                        auVar33._0_8_ = *(ulong *)(uVar28 + lVar30 * 8);
                        auVar32 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_2520 + lVar30 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar23[1] + lVar25) = auVar32;
                        uVar27 = uVar27 & uVar27 - 1;
                        lVar30 = lVar25 + 0x10;
                      } while (uVar27 != 0);
                      pauVar17 = (undefined1 (*) [16])(pauVar23[1] + lVar25);
                      if (lVar25 + 0x10 != 0) {
                        lVar30 = 0x10;
                        pauVar24 = pauVar23;
                        do {
                          auVar32 = pauVar24[1];
                          uVar3 = *(uint *)(pauVar24[1] + 8);
                          pauVar24 = pauVar24 + 1;
                          lVar25 = lVar30;
                          do {
                            if (uVar3 <= *(uint *)(pauVar23[-1] + lVar25 + 8)) {
                              pauVar26 = (undefined1 (*) [16])(*pauVar23 + lVar25);
                              break;
                            }
                            *(undefined1 (*) [16])(*pauVar23 + lVar25) =
                                 *(undefined1 (*) [16])(pauVar23[-1] + lVar25);
                            lVar25 = lVar25 + -0x10;
                            pauVar26 = pauVar23;
                          } while (lVar25 != 0);
                          *pauVar26 = auVar32;
                          lVar30 = lVar30 + 0x10;
                        } while (pauVar17 != pauVar24);
                      }
                      pauVar23 = pauVar17;
                      uVar29 = *(ulong *)*pauVar17;
                    }
                  }
                }
              }
            }
          }
          else {
            iVar21 = 6;
          }
        } while (iVar21 == 0);
      } while ((iVar21 != 6) || (uVar28 = (ulong)((uint)uVar29 & 0xf), uVar28 == 8));
      lVar30 = 0;
      bVar18 = 0;
      do {
        bVar22 = bVar18;
        uVar3 = *(uint *)((uVar29 & 0xfffffffffffffff0) + lVar30 * 8);
        this = (context->scene->geometries).items[uVar3].ptr;
        context->geomID = uVar3;
        context->primID = *(uint *)((uVar29 & 0xfffffffffffffff0) + 4 + lVar30 * 8);
        bVar19 = Geometry::pointQuery(this,query,context);
        lVar30 = lVar30 + 1;
        bVar18 = bVar22 | bVar19;
      } while (uVar28 - 8 != lVar30);
      auVar40 = ZEXT3264(local_23e0);
      auVar41 = ZEXT3264(local_2400);
      auVar42 = ZEXT1664(local_24f0);
      auVar43 = ZEXT3264(local_2420);
      in_ZMM12 = ZEXT3264(local_23c0);
    } while (bVar22 == 0 && !bVar19);
    uVar31 = *(undefined4 *)&(context->query_radius).field_0;
    auVar34._4_4_ = uVar31;
    auVar34._0_4_ = uVar31;
    auVar34._8_4_ = uVar31;
    auVar34._12_4_ = uVar31;
    auVar34._16_4_ = uVar31;
    auVar34._20_4_ = uVar31;
    auVar34._24_4_ = uVar31;
    auVar34._28_4_ = uVar31;
    uVar31 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar36._4_4_ = uVar31;
    auVar36._0_4_ = uVar31;
    auVar36._8_4_ = uVar31;
    auVar36._12_4_ = uVar31;
    auVar36._16_4_ = uVar31;
    auVar36._20_4_ = uVar31;
    auVar36._24_4_ = uVar31;
    auVar36._28_4_ = uVar31;
    uVar31 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar38._4_4_ = uVar31;
    auVar38._0_4_ = uVar31;
    auVar38._8_4_ = uVar31;
    auVar38._12_4_ = uVar31;
    auVar38._16_4_ = uVar31;
    auVar38._20_4_ = uVar31;
    auVar38._24_4_ = uVar31;
    auVar38._28_4_ = uVar31;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar42 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar32 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar42 = ZEXT1664(auVar32);
    }
    bVar20 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }